

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  ostream *poVar2;
  uint nsteps;
  int iVar3;
  uint nstout;
  double slipspring_rate;
  string filename;
  NetwMin netw_min;
  cb3D_integrator b3D_integrator;
  char *local_150;
  char *local_148;
  char local_140;
  undefined7 uStack_13f;
  string local_130;
  NetwMin local_110;
  undefined1 local_e8 [192];
  
  *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 0xc;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"#: Use of the code: ",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "#: ./netmin.x [data_file] [slip-spring creation rate] [nsteps] [nevery_steps]\n",0x4e)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  local_148 = (char *)0x0;
  local_140 = '\0';
  local_150 = &local_140;
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"#: Data file has not been specified from command line.\n",0x37
              );
    std::__cxx11::string::_M_replace((ulong)&local_150,0,local_148,0x10c0b4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"#: --- \'",8);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_150,(long)local_148);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"\' will be used as data file.\n",0x1d);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_e8,argv[1],(allocator<char> *)&local_110);
    std::__cxx11::string::operator=((string *)&local_150,(string *)local_e8);
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
  }
  iVar3 = 1;
  if (2 < argc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_e8,argv[2],(allocator<char> *)&local_110);
    slipspring_rate = StringToNumber<double>((string *)local_e8);
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
    nsteps = 2000000000;
    if (argc != 3) {
      lVar1 = atol(argv[3]);
      nsteps = (uint)lVar1;
    }
    nstout = 1000;
    if (4 < argc) {
      lVar1 = atol(argv[4]);
      nstout = (uint)lVar1;
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,local_150,local_148 + (long)local_150);
    NetworkNS::NetwMin::NetwMin(&local_110,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    NetworkNS::cb3D_integrator::cb3D_integrator
              ((cb3D_integrator *)local_e8,&local_110,500.0,slipspring_rate);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "#: Integrator has been initialized. Simulation will start for ",0x3e);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," steps.\n",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"#: The rate for the slip-spring creation is: ",0x2d);
    poVar2 = std::ostream::_M_insert<double>(slipspring_rate);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"#: The timestep of the integrator will be: ",0x2b);
    poVar2 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ps.\n",5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"#: Report will be written every: ",0x21);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," steps.\n",8);
    NetworkNS::cb3D_integrator::integrate((cb3D_integrator *)local_e8,nsteps,1.0,nstout);
    (**(local_110.my_traj_file)->_vptr_dump)();
    NetworkNS::cb3D_integrator::~cb3D_integrator((cb3D_integrator *)local_e8);
    iVar3 = 0;
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,CONCAT71(uStack_13f,local_140) + 1);
  }
  return iVar3;
}

Assistant:

int main(int argc, char** argv) {

    
   unsigned int bd3D_nsteps = 0, bd3D_write_every = 0;
   
   cout.precision(12);
   
   cout << "#: Use of the code: "<< endl;
   cout << "#: ./netmin.x [data_file] [slip-spring creation rate] [nsteps] [nevery_steps]\n" << endl;
   
   std::string filename;
   if (argc > 1)
      filename = std::string(argv[1]);
   else{
      cout << "#: Data file has not been specified from command line.\n";
      filename = "emsipon.data";
      cout << "#: --- '" << filename << "' will be used as data file.\n";
   }
   
   double creation_rate;
   if (argc > 2)
      creation_rate = StringToNumber<double>(argv[2]);
   else
      return(1);
   
   if (argc > 3)
      bd3D_nsteps = atol(argv[3]);
   else
      bd3D_nsteps = 2000000000;
   
   if (argc > 4)
      bd3D_write_every = atol(argv[4]);
   else
      bd3D_write_every = 1000;
      

#ifdef FENE_SLS  
   cout << "#: (warning): FENE potential will be used for slip-springs.\n";
#endif
   
   // Define a new pointer to the class:
   NetwMin netw_min(filename);
   cb3D_integrator b3D_integrator(&netw_min, 500.0, creation_rate);
   
   cout << "#: Integrator has been initialized. Simulation will start for "<<bd3D_nsteps<< " steps.\n";
   cout << "#: The rate for the slip-spring creation is: " << creation_rate << endl;
   
   // Simulation starts here:
   double timestep = 1.0; // integration timestep in ps.
   cout << "#: The timestep of the integrator will be: " << timestep << " ps.\n";
   cout << "#: Report will be written every: " << bd3D_write_every << " steps.\n";
   
   
   b3D_integrator.integrate(bd3D_nsteps, timestep, bd3D_write_every);
     
   // Close trajectory file:
   netw_min.my_traj_file->~dump();
   
   
   return (EXIT_SUCCESS);
}